

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

int CountNest(char *s)

{
  int iVar1;
  char *__s1;
  char *s_local;
  
  iVar1 = strcmp(s,"ENDC");
  if (iVar1 == 0) {
    s_local._4_4_ = -1;
  }
  else {
    iVar1 = strcmp(s,"ENDIF");
    if (iVar1 == 0) {
      s_local._4_4_ = -1;
    }
    else if (*s == 'I') {
      __s1 = s + 2;
      if (s[1] == 'F') {
        iVar1 = strcmp(__s1,"EQ");
        if (iVar1 == 0) {
          s_local._4_4_ = 1;
        }
        else {
          iVar1 = strcmp(__s1,"NE");
          if (iVar1 == 0) {
            s_local._4_4_ = 1;
          }
          else {
            iVar1 = strcmp(__s1,"GT");
            if (iVar1 == 0) {
              s_local._4_4_ = 1;
            }
            else {
              iVar1 = strcmp(__s1,"GE");
              if (iVar1 == 0) {
                s_local._4_4_ = 1;
              }
              else {
                iVar1 = strcmp(__s1,"LT");
                if (iVar1 == 0) {
                  s_local._4_4_ = 1;
                }
                else {
                  iVar1 = strcmp(__s1,"LE");
                  if (iVar1 == 0) {
                    s_local._4_4_ = 1;
                  }
                  else {
                    iVar1 = strcmp(__s1,"C");
                    if (iVar1 == 0) {
                      s_local._4_4_ = 1;
                    }
                    else {
                      iVar1 = strcmp(__s1,"NC");
                      if (iVar1 == 0) {
                        s_local._4_4_ = 1;
                      }
                      else {
                        iVar1 = strcmp(__s1,"D");
                        if (iVar1 == 0) {
                          s_local._4_4_ = 1;
                        }
                        else {
                          iVar1 = strcmp(__s1,"ND");
                          if (iVar1 == 0) {
                            s_local._4_4_ = 1;
                          }
                          else {
                            s_local._4_4_ = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        s_local._4_4_ = 0;
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

int CountNest(s)
	register char *s;
/* Returns 1 if "s" contains any IF statement (i.e. IFEQ, etc.).
 Returns -1 if "s" contains "ENDC" or "ENDIF".
 Returns 0 in all other cases.              */
{
	if (strcmp(s, "ENDC") == 0)
		return (-1);
	else if (strcmp(s, "ENDIF") == 0)
		return (-1);
	else if (*s++ != 'I')
		return (0);
	else if (*s++ != 'F')
		return (0);
	else if (strcmp(s, "EQ") == 0)
		return (1);
	else if (strcmp(s, "NE") == 0)
		return (1);
	else if (strcmp(s, "GT") == 0)
		return (1);
	else if (strcmp(s, "GE") == 0)
		return (1);
	else if (strcmp(s, "LT") == 0)
		return (1);
	else if (strcmp(s, "LE") == 0)
		return (1);
	else if (strcmp(s, "C") == 0)
		return (1);
	else if (strcmp(s, "NC") == 0)
		return (1);
	else if (strcmp(s, "D") == 0)
		return (1);
	else if (strcmp(s, "ND") == 0)
		return (1);
	else
		return (0);
}